

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privsock.c
# Opt level: O3

int priv_sock_get_int(int fd)

{
  undefined *puVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  ssize_t sVar4;
  ssize_t sVar5;
  hostent *phVar6;
  ulong uVar7;
  uint the_int;
  uint extraout_EDX;
  int *buf;
  ulong uVar8;
  uint uVar9;
  int *piVar10;
  int *piVar11;
  msghdr *__message;
  sockaddr *__addr;
  char *__cp;
  char *pcVar12;
  undefined1 *puVar13;
  int res;
  undefined4 uStack_1ac;
  char acStack_1a8 [24];
  sockaddr sStack_190;
  int *piStack_180;
  char *pcStack_178;
  ulong uStack_170;
  code *pcStack_168;
  sockaddr sStack_154;
  undefined4 uStack_144;
  int *piStack_140;
  char *pcStack_138;
  code *pcStack_130;
  undefined1 uStack_121;
  iovec iStack_120;
  msghdr mStack_110;
  undefined1 auStack_d8 [16];
  code *pcStack_c8;
  undefined1 uStack_b1;
  iovec iStack_b0;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined4 uStack_90;
  undefined1 auStack_80 [48];
  undefined8 uStack_50;
  ulong uStack_40;
  int *piStack_38;
  int local_4;
  
  local_4 = (int)((ulong)in_RAX >> 0x20);
  uVar7 = (ulong)(uint)fd;
  piVar10 = &local_4;
  sVar4 = readn(fd,piVar10,4);
  if ((int)sVar4 == 4) {
    return local_4;
  }
  priv_sock_get_int_cold_1();
  uVar8 = uVar7 & 0xffffffff;
  priv_sock_send_int((int)uVar7,the_int);
  __cp = (char *)(uVar7 & 0xffffffff);
  buf = piVar10;
  sVar4 = writen((int)uVar7,piVar10,(ulong)the_int);
  if ((uint)sVar4 == the_int) {
    return (uint)sVar4;
  }
  priv_sock_send_buf_cold_1();
  iVar3 = (int)__cp;
  pcVar12 = (char *)((ulong)__cp & 0xffffffff);
  uStack_50._0_4_ = 0x106434;
  uStack_50._4_4_ = 0;
  piVar11 = buf;
  uStack_40 = (ulong)the_int;
  piStack_38 = piVar10;
  uVar2 = priv_sock_get_int(iVar3);
  uStack_90 = SUB84(piVar11,0);
  if (extraout_EDX < uVar2) {
    uStack_50._0_4_ = 0x10645c;
    uStack_50._4_4_ = 0;
    priv_sock_recv_buf_cold_2();
  }
  else {
    uVar8 = (ulong)uVar2;
    uStack_50._0_4_ = 0x106448;
    uStack_50._4_4_ = 0;
    piVar10 = buf;
    __cp = pcVar12;
    sVar4 = readn(iVar3,buf,(ulong)uVar2);
    uStack_90 = SUB84(piVar10,0);
    if (uVar2 == (uint)sVar4) {
      return (uint)sVar4;
    }
  }
  uStack_50 = priv_sock_send_fd;
  priv_sock_recv_buf_cold_1();
  iStack_b0.iov_base = &uStack_b1;
  uStack_b1 = 0;
  auStack_80._32_8_ = &uStack_a0;
  auStack_80._40_8_ = 0x18;
  uStack_98 = 0x100000001;
  uStack_a0 = 0x14;
  auStack_80._0_8_ = (void *)0x0;
  auStack_80._8_4_ = 0;
  auStack_80._16_8_ = &iStack_b0;
  auStack_80._24_8_ = 1;
  uStack_50 = (code *)((ulong)uStack_50 & 0xffffffff00000000);
  iStack_b0.iov_len = 1;
  pcStack_c8 = (code *)0x106d18;
  sVar5 = sendmsg((int)__cp,(msghdr *)auStack_80,0);
  if ((int)sVar5 == 1) {
    return 1;
  }
  pcStack_c8 = recv_fd;
  send_fd_cold_1();
  iStack_120.iov_base = &uStack_121;
  mStack_110.msg_iov = &iStack_120;
  iStack_120.iov_len = 1;
  __message = &mStack_110;
  mStack_110.msg_name = (void *)0x0;
  mStack_110.msg_namelen = 0;
  mStack_110.msg_iovlen = 1;
  mStack_110.msg_control = auStack_d8;
  mStack_110.msg_controllen = 0x18;
  mStack_110.msg_flags = 0;
  pcStack_c8 = (code *)CONCAT44(pcStack_c8._4_4_,0xffffffff);
  pcStack_130 = (code *)0x106d7c;
  sVar5 = recvmsg((int)__cp,__message,0);
  if ((int)sVar5 == 1) {
    if ((mStack_110.msg_controllen < 0x10) ||
       ((undefined1 *)mStack_110.msg_control == (undefined1 *)0x0)) goto LAB_00106da5;
    if (*(int *)((long)mStack_110.msg_control + 0x10) != -1) {
      return *(int *)((long)mStack_110.msg_control + 0x10);
    }
  }
  else {
    pcStack_130 = (code *)0x106da5;
    recv_fd_cold_1();
LAB_00106da5:
    pcStack_130 = (code *)0x106daa;
    recv_fd_cold_3();
  }
  pcStack_130 = tcp_server;
  recv_fd_cold_2();
  uVar7 = (ulong)__message & 0xffffffff;
  pcStack_168 = (code *)0x106dcd;
  piStack_140 = buf;
  pcStack_138 = pcVar12;
  pcStack_130 = (code *)uVar8;
  uVar2 = socket(2,1,0);
  if ((int)uVar2 < 0) {
    pcStack_168 = (code *)0x106e81;
    tcp_server_cold_3();
LAB_00106e81:
    iVar3 = (int)buf;
    pcStack_168 = (code *)0x106e88;
    tcp_server_cold_2();
  }
  else {
    buf = (int *)(ulong)uVar2;
    sStack_154.sa_data[10] = '\0';
    sStack_154.sa_data[0xb] = '\0';
    sStack_154.sa_data[0xc] = '\0';
    sStack_154.sa_data[0xd] = '\0';
    sStack_154.sa_data[2] = '\0';
    sStack_154.sa_data[3] = '\0';
    sStack_154.sa_data[4] = '\0';
    sStack_154.sa_data[5] = '\0';
    sStack_154.sa_data[6] = '\0';
    sStack_154.sa_data[7] = '\0';
    sStack_154.sa_data[8] = '\0';
    sStack_154.sa_data[9] = '\0';
    sStack_154.sa_family = 2;
    sStack_154.sa_data._0_2_ = (ushort)uVar7 << 8 | (ushort)uVar7 >> 8;
    uVar7 = CONCAT62((int6)(uVar7 >> 0x10),sStack_154.sa_data._0_2_);
    if (__cp == (char *)0x0) {
LAB_00106e2d:
      uStack_144 = 1;
      pcStack_168 = (code *)0x106e4f;
      setsockopt(uVar2,1,2,&uStack_144,4);
      pcStack_168 = (code *)0x106e60;
      iVar3 = bind(uVar2,&sStack_154,0x10);
      if (iVar3 != -1) {
        pcStack_168 = (code *)0x106e71;
        listen(uVar2,0x400);
        return uVar2;
      }
      goto LAB_00106e81;
    }
    pcStack_168 = (code *)0x106e0f;
    iVar3 = inet_pton(2,__cp,sStack_154.sa_data + 2);
    if (iVar3 != 0) goto LAB_00106e2d;
    pcStack_168 = (code *)0x106e1b;
    pcVar12 = __cp;
    phVar6 = gethostbyname(__cp);
    iVar3 = (int)pcVar12;
    if (phVar6 != (hostent *)0x0) {
      sStack_154.sa_data._2_4_ = *(undefined4 *)*phVar6->h_addr_list;
      goto LAB_00106e2d;
    }
  }
  pcStack_168 = tcp_client;
  tcp_server_cold_1();
  puVar13 = (undefined1 *)0x2;
  __addr = (sockaddr *)0x1;
  piStack_180 = buf;
  pcStack_178 = __cp;
  uStack_170 = (ulong)extraout_EDX;
  pcStack_168 = (code *)uVar7;
  uVar2 = socket(2,1,0);
  if (-1 < (int)uVar2) {
    if (iVar3 != 0) {
      uStack_1ac = 1;
      setsockopt(uVar2,1,2,&uStack_1ac,4);
      acStack_1a8[0] = '\0';
      acStack_1a8[1] = '\0';
      acStack_1a8[2] = '\0';
      acStack_1a8[3] = '\0';
      acStack_1a8[4] = '\0';
      acStack_1a8[5] = '\0';
      acStack_1a8[6] = '\0';
      acStack_1a8[7] = '\0';
      acStack_1a8[8] = '\0';
      acStack_1a8[9] = '\0';
      acStack_1a8[10] = '\0';
      acStack_1a8[0xb] = '\0';
      acStack_1a8[0xc] = '\0';
      acStack_1a8[0xd] = '\0';
      acStack_1a8[0xe] = '\0';
      acStack_1a8[0xf] = '\0';
      getlocalip(acStack_1a8);
      __addr = &sStack_190;
      sStack_190.sa_data[6] = '\0';
      sStack_190.sa_data[7] = '\0';
      sStack_190.sa_data[8] = '\0';
      sStack_190.sa_data[9] = '\0';
      sStack_190.sa_data[10] = '\0';
      sStack_190.sa_data[0xb] = '\0';
      sStack_190.sa_data[0xc] = '\0';
      sStack_190.sa_data[0xd] = '\0';
      sStack_190.sa_family = 2;
      sStack_190.sa_data._0_2_ = (short)iVar3;
      sStack_190.sa_data._2_4_ = inet_addr(acStack_1a8);
      puVar13 = (undefined1 *)(ulong)uVar2;
      iVar3 = bind(uVar2,__addr,0x10);
      if (iVar3 < 0) goto LAB_00106f37;
    }
    return uVar2;
  }
  tcp_client_cold_2();
LAB_00106f37:
  tcp_client_cold_1();
  *puVar13 = 0x3f;
  uVar9 = (uint)__addr;
  uVar2 = (uVar9 & 0xf000) - 0x1000;
  uVar7 = (ulong)uVar2;
  if ((uVar2 < 0xc000) &&
     (uVar7 = (ulong)(uVar2 >> 0xc), (0xaabU >> (uVar2 >> 0xc & 0x1f) & 1) != 0)) {
    puVar1 = &DAT_00108f04 + uVar7;
    uVar7 = (ulong)CONCAT31((uint3)(uVar2 >> 0x14),*puVar1);
    *puVar13 = *puVar1;
  }
  if ((uVar9 >> 8 & 1) != 0) {
    puVar13[1] = 0x72;
  }
  if ((char)__addr < '\0') {
    puVar13[2] = 0x77;
  }
  if (((ulong)__addr & 0x40) != 0) {
    puVar13[3] = 0x78;
  }
  if (((ulong)__addr & 0x20) != 0) {
    puVar13[4] = 0x72;
  }
  if (((ulong)__addr & 0x10) != 0) {
    puVar13[5] = 0x77;
  }
  if (((ulong)__addr & 8) != 0) {
    puVar13[6] = 0x78;
  }
  if (((ulong)__addr & 4) != 0) {
    puVar13[7] = 0x72;
  }
  if (((ulong)__addr & 2) != 0) {
    puVar13[8] = 0x77;
  }
  if (((ulong)__addr & 1) != 0) {
    puVar13[9] = 0x78;
  }
  if ((uVar9 >> 0xb & 1) != 0) {
    uVar7 = CONCAT71((int7)(uVar7 >> 8),(puVar13[3] == 'x') << 5) | 0x53;
    puVar13[3] = (char)uVar7;
  }
  if ((uVar9 >> 10 & 1) != 0) {
    uVar7 = CONCAT71((int7)(uVar7 >> 8),(puVar13[6] == 'x') << 5) | 0x53;
    puVar13[6] = (char)uVar7;
  }
  iVar3 = (int)uVar7;
  if ((uVar9 >> 9 & 1) != 0) {
    uVar7 = CONCAT71((int7)(uVar7 >> 8),(puVar13[9] == 'x') << 5) | 0x53;
    iVar3 = (int)uVar7;
    puVar13[9] = (char)uVar7;
  }
  return iVar3;
}

Assistant:

int priv_sock_get_int(int fd) {
  int res;
  int ret;
  ret = readn(fd, &res, sizeof(res));
  if (ret != sizeof(res)) {
    fprintf(stderr, "priv_sock_get_result error\n");
    exit(EXIT_FAILURE);
  }
  return res;
}